

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v5::internal::
     handle_float_type_spec<char,fmt::v5::internal::float_type_checker<fmt::v5::internal::error_handler>>
               (char spec,float_type_checker<fmt::v5::internal::error_handler> *handler)

{
  float_type_checker<fmt::v5::internal::error_handler> *handler_local;
  char spec_local;
  
  if (spec != '\0') {
    if (spec == 'A') {
LAB_002c7a60:
      float_type_checker<fmt::v5::internal::error_handler>::on_hex(handler);
      return;
    }
    if (spec == 'E') {
LAB_002c7a4a:
      float_type_checker<fmt::v5::internal::error_handler>::on_exp(handler);
      return;
    }
    if (spec == 'F') {
LAB_002c7a55:
      float_type_checker<fmt::v5::internal::error_handler>::on_fixed(handler);
      return;
    }
    if (spec != 'G') {
      if (spec == 'a') goto LAB_002c7a60;
      if (spec == 'e') goto LAB_002c7a4a;
      if (spec == 'f') goto LAB_002c7a55;
      if (spec != 'g') {
        float_type_checker<fmt::v5::internal::error_handler>::on_error(handler);
        return;
      }
    }
  }
  float_type_checker<fmt::v5::internal::error_handler>::on_general(handler);
  return;
}

Assistant:

FMT_CONSTEXPR void handle_float_type_spec(Char spec, Handler &&handler) {
  switch (spec) {
  case 0: case 'g': case 'G':
    handler.on_general();
    break;
  case 'e': case 'E':
    handler.on_exp();
    break;
  case 'f': case 'F':
    handler.on_fixed();
    break;
   case 'a': case 'A':
    handler.on_hex();
    break;
  default:
    handler.on_error();
    break;
  }
}